

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server.c
# Opt level: O2

int socket_server_udp_connect(socket_server *ss,int id,char *addr,int port)

{
  sockaddr *psVar1;
  bool bVar2;
  int iVar3;
  addrinfo *ai_list;
  char portstr [16];
  addrinfo local_268;
  request_package request;
  
  ai_list = (addrinfo *)0x0;
  sprintf(portstr,"%d",(ulong)(uint)port);
  local_268.ai_flags = 0;
  local_268.ai_family = 0;
  local_268.ai_addrlen = 0;
  local_268._20_4_ = 0;
  local_268.ai_addr = (sockaddr *)0x0;
  local_268.ai_canonname = (char *)0x0;
  local_268.ai_next = (addrinfo *)0x0;
  local_268.ai_socktype = 2;
  local_268.ai_protocol = 0x11;
  iVar3 = getaddrinfo(addr,portstr,&local_268,(addrinfo **)&ai_list);
  if (iVar3 == 0) {
    request.u.open.id = id;
    if (ai_list->ai_family == 2) {
      bVar2 = true;
      request.u.buffer[4] = '\x01';
    }
    else {
      if (ai_list->ai_family != 10) {
        freeaddrinfo((addrinfo *)ai_list);
        goto LAB_00110b1b;
      }
      request.u.buffer[4] = '\x02';
      bVar2 = false;
    }
    psVar1 = ai_list->ai_addr;
    request.u.open.port._1_2_ = *(undefined2 *)psVar1->sa_data;
    if (bVar2) {
      request.u._7_4_ = *(undefined4 *)(psVar1->sa_data + 2);
      iVar3 = 0xc;
    }
    else {
      request.u._7_8_ = *(undefined8 *)(psVar1->sa_data + 6);
      request.u._15_2_ = psVar1[1].sa_family;
      request.u._17_1_ = psVar1[1].sa_data[0];
      request.u._18_1_ = psVar1[1].sa_data[1];
      request.u._19_1_ = psVar1[1].sa_data[2];
      request.u._20_1_ = psVar1[1].sa_data[3];
      request.u._21_1_ = psVar1[1].sa_data[4];
      request.u._22_1_ = psVar1[1].sa_data[5];
      iVar3 = 0x18;
    }
    freeaddrinfo((addrinfo *)ai_list);
    send_request(ss,&request,'C',iVar3);
    iVar3 = 0;
  }
  else {
LAB_00110b1b:
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int
socket_server_udp_connect(struct socket_server *ss, int id, const char * addr, int port) {
	int status;
	struct addrinfo ai_hints;
	struct addrinfo *ai_list = NULL;
	char portstr[16];
	sprintf(portstr, "%d", port);
	memset( &ai_hints, 0, sizeof( ai_hints ) );
	ai_hints.ai_family = AF_UNSPEC;
	ai_hints.ai_socktype = SOCK_DGRAM;
	ai_hints.ai_protocol = IPPROTO_UDP;

	status = getaddrinfo(addr, portstr, &ai_hints, &ai_list );
	if ( status != 0 ) {
		return -1;
	}
	struct request_package request;
	request.u.set_udp.id = id;
	int protocol;

	if (ai_list->ai_family == AF_INET) {
		protocol = PROTOCOL_UDP;
	} else if (ai_list->ai_family == AF_INET6) {
		protocol = PROTOCOL_UDPv6;
	} else {
		freeaddrinfo( ai_list );
		return -1;
	}

	int addrsz = gen_udp_address(protocol, (union sockaddr_all *)ai_list->ai_addr, request.u.set_udp.address);

	freeaddrinfo( ai_list );

	send_request(ss, &request, 'C', sizeof(request.u.set_udp) - sizeof(request.u.set_udp.address) +addrsz);

	return 0;
}